

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

uint8_t * ures_getBinary_63(UResourceBundle *resB,int32_t *len,UErrorCode *status)

{
  UBool UVar1;
  uint8_t *p;
  UErrorCode *status_local;
  int32_t *len_local;
  UResourceBundle *resB_local;
  
  if ((status == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    resB_local = (UResourceBundle *)0x0;
  }
  else if (resB == (UResourceBundle *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    resB_local = (UResourceBundle *)0x0;
  }
  else {
    resB_local = (UResourceBundle *)res_getBinary_63(&resB->fResData,resB->fRes,len);
    if (resB_local == (UResourceBundle *)0x0) {
      *status = U_RESOURCE_TYPE_MISMATCH;
    }
  }
  return (uint8_t *)resB_local;
}

Assistant:

U_CAPI const uint8_t* U_EXPORT2 ures_getBinary(const UResourceBundle* resB, int32_t* len, 
                                               UErrorCode*               status) {
  const uint8_t *p;
  if (status==NULL || U_FAILURE(*status)) {
    return NULL;
  }
  if(resB == NULL) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return NULL;
  }
  p = res_getBinary(&(resB->fResData), resB->fRes, len);
  if (p == NULL) {
    *status = U_RESOURCE_TYPE_MISMATCH;
  }
  return p;
}